

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::postCalculation(ForceManager *this)

{
  bool bVar1;
  uint uVar2;
  SnapshotManager *this_00;
  double *pdVar3;
  StuntDouble *in_RDI;
  StuntDouble *sd;
  IntegrableObjectIterator ii;
  Vector3d t;
  Vector3d f;
  RealType pe;
  Mat3x3d rbTau;
  Snapshot *curSnapshot;
  RigidBody *rb;
  RigidBodyIterator rbIter;
  Molecule *mol;
  MoleculeIterator mi;
  ForceModifier **forceModifier;
  iterator __end1;
  iterator __begin1;
  vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *__range1;
  RigidBody *in_stack_00000338;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffec8;
  Snapshot *in_stack_fffffffffffffed0;
  iterator *in_stack_fffffffffffffee8;
  SimInfo *in_stack_fffffffffffffef0;
  StuntDouble *local_f0;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_e8;
  Vector<double,_3U> local_e0;
  Vector<double,_3U> local_c8;
  double local_b0;
  Snapshot *local_50;
  RigidBody *local_48;
  Molecule *local_38;
  pointer local_28;
  iterator local_20;
  iterator local_18;
  int *local_10;
  
  local_10 = &in_RDI[4].globalIndex_;
  local_18 = std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::begin
                       ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *
                        )in_stack_fffffffffffffec8);
  local_20 = std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>::end
                       ((vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_> *
                        )in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
                             *)in_stack_fffffffffffffed0,
                            (__normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
                             *)in_stack_fffffffffffffec8), bVar1) {
    local_28 = (pointer)__gnu_cxx::
                        __normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
                        ::operator*(&stack0xffffffffffffffe8);
    (*((ForceModifier *)(local_28->super_Vector<double,_3U>).data_[0])->_vptr_ForceModifier[2])();
    __gnu_cxx::
    __normal_iterator<OpenMD::ForceModifier_**,_std::vector<OpenMD::ForceModifier_*,_std::allocator<OpenMD::ForceModifier_*>_>_>
    ::operator++(&stack0xffffffffffffffe8);
  }
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)
             &stack0xffffffffffffffd0);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
                       *)&stack0xffffffffffffffc0);
  this_00 = SimInfo::getSnapshotManager((SimInfo *)in_RDI->snapshotMan_);
  local_50 = SnapshotManager::getCurrentSnapshot(this_00);
  local_38 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffef0,(MoleculeIterator *)in_stack_fffffffffffffee8);
  while (local_38 != (Molecule *)0x0) {
    local_48 = Molecule::beginRigidBody
                         ((Molecule *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    while (local_48 != (RigidBody *)0x0) {
      in_stack_fffffffffffffed0 = (Snapshot *)&stack0xffffffffffffff68;
      RigidBody::calcForcesAndTorquesAndVirial(in_stack_00000338);
      RectMatrix<double,_3U,_3U>::operator+=
                ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x30f6b7);
      local_48 = Molecule::nextRigidBody
                           ((Molecule *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
    local_38 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffef0,(MoleculeIterator *)in_stack_fffffffffffffee8);
  }
  Snapshot::setVirialTensor(in_stack_fffffffffffffed0,(Mat3x3d *)in_stack_fffffffffffffec8);
  local_b0 = Snapshot::getPotentialEnergy(in_stack_fffffffffffffed0);
  uVar2 = std::isinf(local_b0);
  if (((uVar2 & 1) != 0) || (uVar2 = std::isnan(local_b0), (uVar2 & 1) != 0)) {
    snprintf(painCave.errMsg,2000,
             "ForceManager detected a numerical error in the potential energy.\n\tStopping the simulation."
            );
    painCave.isFatal = 1;
    simError();
  }
  Vector3<double>::Vector3((Vector3<double> *)0x30f7b0);
  Vector3<double>::Vector3((Vector3<double> *)0x30f7ba);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_e8);
  local_38 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffef0,(MoleculeIterator *)in_stack_fffffffffffffee8);
  do {
    if (local_38 == (Molecule *)0x0) {
      errorCheckPoint();
      return;
    }
    local_f0 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_fffffffffffffef0,
                          (iterator *)in_stack_fffffffffffffee8);
    while (local_f0 != (StuntDouble *)0x0) {
      StuntDouble::getFrc(in_RDI);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffed0,
                 (Vector3<double> *)in_stack_fffffffffffffec8);
      pdVar3 = Vector<double,_3U>::operator[](&local_c8,0);
      uVar2 = std::isinf(*pdVar3);
      if ((uVar2 & 1) == 0) {
        pdVar3 = Vector<double,_3U>::operator[](&local_c8,0);
        uVar2 = std::isnan(*pdVar3);
        if ((uVar2 & 1) != 0) goto LAB_0030f8da;
        pdVar3 = Vector<double,_3U>::operator[](&local_c8,1);
        uVar2 = std::isinf(*pdVar3);
        if ((uVar2 & 1) != 0) goto LAB_0030f8da;
        pdVar3 = Vector<double,_3U>::operator[](&local_c8,1);
        uVar2 = std::isnan(*pdVar3);
        if ((uVar2 & 1) != 0) goto LAB_0030f8da;
        pdVar3 = Vector<double,_3U>::operator[](&local_c8,2);
        uVar2 = std::isinf(*pdVar3);
        if ((uVar2 & 1) != 0) goto LAB_0030f8da;
        pdVar3 = Vector<double,_3U>::operator[](&local_c8,2);
        uVar2 = std::isnan(*pdVar3);
        if ((uVar2 & 1) != 0) goto LAB_0030f8da;
      }
      else {
LAB_0030f8da:
        uVar2 = StuntDouble::getGlobalIndex(local_f0);
        snprintf(painCave.errMsg,2000,
                 "ForceManager detected a numerical error in the force for object %d",(ulong)uVar2);
        painCave.isFatal = 1;
        simError();
      }
      bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffed0);
      if (bVar1) {
        StuntDouble::getTrq(in_RDI);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffed0,
                   (Vector3<double> *)in_stack_fffffffffffffec8);
        pdVar3 = Vector<double,_3U>::operator[](&local_e0,0);
        uVar2 = std::isinf(*pdVar3);
        if ((uVar2 & 1) == 0) {
          pdVar3 = Vector<double,_3U>::operator[](&local_e0,0);
          uVar2 = std::isnan(*pdVar3);
          if ((uVar2 & 1) == 0) {
            pdVar3 = Vector<double,_3U>::operator[](&local_e0,1);
            uVar2 = std::isinf(*pdVar3);
            if ((uVar2 & 1) == 0) {
              pdVar3 = Vector<double,_3U>::operator[](&local_e0,1);
              uVar2 = std::isnan(*pdVar3);
              if ((uVar2 & 1) == 0) {
                pdVar3 = Vector<double,_3U>::operator[](&local_e0,2);
                uVar2 = std::isinf(*pdVar3);
                if ((uVar2 & 1) == 0) {
                  pdVar3 = Vector<double,_3U>::operator[](&local_e0,2);
                  uVar2 = std::isnan(*pdVar3);
                  if ((uVar2 & 1) == 0) goto LAB_0030fa2d;
                }
              }
            }
          }
        }
        uVar2 = StuntDouble::getGlobalIndex(local_f0);
        snprintf(painCave.errMsg,2000,
                 "ForceManager detected a numerical error in the torque for object %d",(ulong)uVar2)
        ;
        painCave.isFatal = 1;
        simError();
      }
LAB_0030fa2d:
      local_f0 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_fffffffffffffef0,
                            (iterator *)in_stack_fffffffffffffee8);
    }
    local_38 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffef0,(MoleculeIterator *)in_stack_fffffffffffffee8);
  } while( true );
}

Assistant:

void ForceManager::postCalculation() {
    for (auto& forceModifier : forceModifiers_)
      forceModifier->modifyForces();

    // Modify the rigid bodies in response to the applied force modifications
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();

    // Collect the atomic forces onto rigid bodies
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        Mat3x3d rbTau = rb->calcForcesAndTorquesAndVirial();
        virialTensor += rbTau;
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, virialTensor.getArrayPointer(), 9, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif
    curSnapshot->setVirialTensor(virialTensor);

    /*
      if (info_->getSimParams()->getUseLongRangeCorrections()) {
        RealType vol = curSnapshot->getVolume();
        RealType Elrc(0.0);
        RealType Wlrc(0.0);

        AtomTypeSet::iterator i;
        AtomTypeSet::iterator j;

        RealType n_i, n_j;
        RealType rho_i, rho_j;
        pair<RealType, RealType> LRI;

        for (i = atomTypes_.begin(); i != atomTypes_.end(); ++i) {
        n_i = RealType(info_->getGlobalCountOfType(*i));
        rho_i = n_i /  vol;
        for (j = atomTypes_.begin(); j != atomTypes_.end(); ++j) {
        n_j = RealType(info_->getGlobalCountOfType(*j));
        rho_j = n_j / vol;

        LRI = interactionMan_->getLongRangeIntegrals( (*i), (*j) );

        Elrc += n_i   * rho_j * LRI.first;
        Wlrc -= rho_i * rho_j * LRI.second;
        }
        }
        Elrc *= 2.0 * Constants::PI;
        Wlrc *= 2.0 * Constants::PI;

        RealType lrp = curSnapshot->getLongRangePotential();
        curSnapshot->setLongRangePotential(lrp + Elrc);
        virialTensor += Wlrc * SquareMatrix3<RealType>::identity();
        curSnapshot->setVirialTensor(virialTensor);
      }
    */

    // Sanity check on PE - don't wait for StatWriter or DumpWriter.
    RealType pe = curSnapshot->getPotentialEnergy();
    if (std::isinf(pe) || std::isnan(pe)) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "ForceManager detected a numerical error in the potential energy.\n"
          "\tStopping the simulation.");
      painCave.isFatal = 1;
      simError();
    }
    Vector3d f;
    Vector3d t;

    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        f = sd->getFrc();
        if (std::isinf(f[0]) || std::isnan(f[0]) || std::isinf(f[1]) ||
            std::isnan(f[1]) || std::isinf(f[2]) || std::isnan(f[2])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "ForceManager detected a numerical error in the force"
                   " for object %d",
                   sd->getGlobalIndex());
          painCave.isFatal = 1;
          simError();
        }
        if (sd->isDirectional()) {
          t = sd->getTrq();
          if (std::isinf(t[0]) || std::isnan(t[0]) || std::isinf(t[1]) ||
              std::isnan(t[1]) || std::isinf(t[2]) || std::isnan(t[2])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "ForceManager detected a numerical error in the torque"
                     " for object %d",
                     sd->getGlobalIndex());
            painCave.isFatal = 1;
            simError();
          }
        }
      }
    }
    errorCheckPoint();
  }